

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolic_invert.cc
# Opt level: O1

void ipx::SymbolicInvert(Model *model,vector<int,_std::allocator<int>_> *basis,Int *rowcounts,
                        Int *colcounts)

{
  uint uVar1;
  int iVar2;
  Int *pIVar3;
  Int *pIVar4;
  int *piVar5;
  pointer piVar6;
  Int *Ai;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  result_type_conflict2 rVar10;
  uint uVar11;
  Int IVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  size_type sVar19;
  pointer piVar20;
  vector<int,_std::allocator<int>_> stack;
  allocator_type local_249;
  vector<int,_std::allocator<int>_> marked;
  vector<int,_std::allocator<int>_> work;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  blocks;
  vector<int,_std::allocator<int>_> marked_1;
  Int *local_1e0;
  pointer local_1c8;
  pointer local_1b0;
  pointer local_198;
  value_type_conflict2 local_174;
  vector<int,_std::allocator<int>_> work_1;
  Int *local_150;
  pointer local_138;
  pointer local_120;
  pointer local_108;
  vector<int,_std::allocator<int>_> jmatch;
  default_random_engine re;
  pointer local_c0;
  pointer local_a8;
  pointer local_90;
  pointer local_78;
  pointer local_60;
  
  pdVar9 = local_198;
  piVar8 = local_1b0;
  pdVar7 = local_1c8;
  Ai = local_1e0;
  uVar1 = (model->AI_).nrow_;
  re._M_x = 1;
  uVar11 = (uint)((ulong)((long)(basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
  marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = uVar11 - 1;
  marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(&work,basis);
  if (0 < (int)uVar11) {
    uVar15 = 0;
    do {
      piVar6 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      rVar10 = std::uniform_int_distribution<int>::operator()
                         ((uniform_int_distribution<int> *)&marked_1,&re,(param_type *)&marked_1);
      iVar14 = piVar6[uVar15];
      piVar6[uVar15] =
           work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[rVar10];
      work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [rVar10] = iVar14;
      uVar15 = uVar15 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar15);
  }
  iVar14 = model->num_rows_;
  sVar19 = (size_type)iVar14;
  iVar2 = model->num_cols_;
  pIVar3 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  re._M_x._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&jmatch,sVar19,(value_type_conflict2 *)&re,(allocator_type *)&marked_1);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&re,pIVar3,pIVar3 + (long)iVar2 + sVar19,
             (allocator_type *)&marked_1);
  work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&marked_1,(long)iVar2 + sVar19,(value_type_conflict2 *)&work_1,(allocator_type *)&stack
            );
  std::vector<int,_std::allocator<int>_>::vector(&work_1,sVar19,(allocator_type *)&stack);
  sVar19 = (size_type)(iVar14 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar19,(allocator_type *)&marked);
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar19,(allocator_type *)&blocks);
  piVar6 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar20 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
      piVar13 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start, piVar20 != piVar6; piVar20 = piVar20 + 1) {
    iVar14 = *piVar20;
    if (pIVar3[(long)iVar14 + 1] == pIVar3[iVar14] + 1) {
      AugmentingPath(iVar14,pIVar3,pIVar4,
                     jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,(Int *)re._M_x,
                     (Int *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
    }
  }
  for (; piVar13 !=
         work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish; piVar13 = piVar13 + 1) {
    iVar14 = *piVar13;
    if (pIVar3[(long)iVar14 + 1] != pIVar3[iVar14] + 1) {
      AugmentingPath(iVar14,pIVar3,pIVar4,
                     jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,(Int *)re._M_x,
                     (Int *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
    }
  }
  if ((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (re._M_x != 0) {
    operator_delete((void *)re._M_x);
  }
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  CopyColumns((SparseMatrix *)&re,&model->AI_,&jmatch);
  Transpose((SparseMatrix *)&marked_1,(SparseMatrix *)&re);
  piVar6 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  re._M_x._0_4_ =
       marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_c0 != (pointer)0x0) {
    operator_delete(local_c0);
  }
  local_1e0 = (Int *)0x0;
  if (local_a8 != (pointer)0x0) {
    operator_delete(local_a8);
  }
  local_1c8 = (pointer)0x0;
  if (local_90 != (pointer)0x0) {
    operator_delete(local_90);
  }
  local_1b0 = (pointer)0x0;
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78);
  }
  local_198 = (pointer)0x0;
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60);
  }
  if (marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    operator_delete(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  uVar11 = (model->AI_).nrow_;
  uVar15 = (ulong)uVar11;
  pIVar3 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar19 = (size_type)(int)uVar11;
  std::vector<int,_std::allocator<int>_>::vector(&marked_1,sVar19,(allocator_type *)&work_1);
  std::vector<int,_std::allocator<int>_>::vector(&work_1,sVar19,(allocator_type *)&stack);
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar19,(allocator_type *)&marked);
  if (0 < (int)uVar11) {
    uVar17 = 0;
    do {
      if (((Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_))[uVar17] != 1) {
        uVar11 = DepthFirstSearch((Int)uVar17,pIVar3,pIVar4,
                                  jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,uVar11,
                                  (Int *)CONCAT44(marked_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  marked_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int *)CONCAT44(work_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  work_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),1,
                                  (Int *)CONCAT44(stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar19,(allocator_type *)&work);
  piVar20 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  piVar13 = (int *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (piVar13 !=
      marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      if (((Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_))[*piVar13] != 2) {
        uVar11 = DepthFirstSearch(*piVar13,piVar6,Ai,(Int *)0x0,(int)uVar15,
                                  (Int *)CONCAT44(marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int *)CONCAT44(work_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  work_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),2,
                                  (Int *)CONCAT44(stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_));
        std::vector<int,std::allocator<int>>::
        vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)&work,
                   (int *)(CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_) + (long)(int)uVar11 * 4)
                   ,(int *)(CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + (long)(int)uVar15 * 4
                           ),(allocator_type *)&local_174);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&blocks,&work);
        if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar15 = (ulong)uVar11;
      }
      piVar13 = piVar13 + 1;
    } while (piVar13 != piVar20);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
            (blocks.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             blocks.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  sVar19 = (size_type)(int)re._M_x;
  lVar16 = (long)blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&work_1,sVar19,(value_type_conflict2 *)&stack,(allocator_type *)&marked);
  uVar11 = (int)(lVar16 >> 3) * -0x55555555;
  if (0 < (int)uVar11) {
    uVar15 = 0;
    do {
      piVar5 = blocks.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar13 = blocks.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar13 != piVar5; piVar13 = piVar13 + 1) {
        *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (long)*piVar13 * 4) =
             (int)uVar15;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uVar11 & 0x7fffffff));
  }
  SparseMatrix::SparseMatrix((SparseMatrix *)&marked_1,uVar11,0);
  marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&stack,sVar19,(value_type_conflict2 *)&marked,(allocator_type *)&work);
  if (0 < (int)uVar11) {
    uVar15 = 0;
    do {
      piVar5 = blocks.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar13 = blocks.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar13 != piVar5; piVar13 = piVar13 + 1) {
        lVar18 = (long)*piVar13;
        lVar16 = (long)piVar6[lVar18];
        if (piVar6[lVar18] < piVar6[lVar18 + 1]) {
          do {
            iVar14 = *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_) +
                             (long)Ai[lVar16] * 4);
            if (uVar15 != *(uint *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             stack.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   (long)iVar14 * 4)) {
              *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + (long)iVar14 * 4) =
                   (int)uVar15;
              SparseMatrix::push_back((SparseMatrix *)&marked_1,iVar14,1.0);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < piVar6[lVar18 + 1]);
        }
      }
      SparseMatrix::add_column((SparseMatrix *)&marked_1);
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uVar11 & 0x7fffffff));
  }
  if ((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  uVar11 = (int)((long)blocks.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)blocks.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  sVar19 = (size_type)(int)uVar11;
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar19,(allocator_type *)&work_1);
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar19,(allocator_type *)&work_1);
  std::vector<int,_std::allocator<int>_>::vector(&work,sVar19,(allocator_type *)&work_1);
  if (rowcounts != (Int *)0x0) {
    local_174 = -1;
    std::vector<int,_std::allocator<int>_>::vector
              (&work_1,((long)(model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000
                       >> 0x20,&local_174,&local_249);
    piVar20 = (pointer)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
    if (piVar20 !=
        marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(piVar20,0xff,
             ((long)marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + (-4 - (long)piVar20) & 0xfffffffffffffffcU)
             + 4);
    }
    piVar20 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    if (0 < (int)uVar11) {
      uVar15 = 0;
      do {
        IVar12 = DepthFirstSearch((Int)uVar15,piVar20,(Int *)0x0,(Int *)0x0,uVar11,
                                  (Int *)CONCAT44(stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int *)CONCAT44(marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int)uVar15,
                                  work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
        iVar14 = 0;
        if (IVar12 < (int)uVar11) {
          uVar17 = (ulong)IVar12;
          iVar14 = 0;
          do {
            iVar2 = *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_) + uVar17 * 4);
            iVar14 = iVar14 + (int)((ulong)((long)blocks.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)blocks.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
            uVar17 = uVar17 + 1;
          } while ((uVar11 & 0x7fffffff) != uVar17);
        }
        piVar13 = blocks.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar5 = blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        if (piVar13 != piVar5) {
          do {
            *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) +
                    (long)jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[*piVar13] * 4) = iVar14;
            piVar13 = piVar13 + 1;
          } while (piVar13 != piVar5);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uVar11 & 0x7fffffff));
    }
    if (0 < (int)uVar1) {
      piVar20 = (basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar15 = 0;
      do {
        rowcounts[uVar15] =
             *(Int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) + (long)piVar20[uVar15] * 4);
        uVar15 = uVar15 + 1;
      } while (uVar1 != uVar15);
    }
    if ((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._0_4_));
    }
  }
  if (colcounts != (Int *)0x0) {
    Transpose((SparseMatrix *)&work_1,(SparseMatrix *)&marked_1);
    piVar20 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_;
    marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
    marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (piVar20 != (pointer)0x0) {
      operator_delete(piVar20);
    }
    local_1e0 = local_150;
    local_1c8 = local_138;
    local_1b0 = local_120;
    local_198 = local_108;
    if (work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      operator_delete(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
    piVar20 = (pointer)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
    if (piVar20 !=
        marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(piVar20,0xff,
             ((long)marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + (-4 - (long)piVar20) & 0xfffffffffffffffcU)
             + 4);
    }
    piVar20 = marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    if (0 < (int)uVar11) {
      uVar15 = 0;
      do {
        IVar12 = DepthFirstSearch((Int)uVar15,piVar20,local_150,(Int *)0x0,uVar11,
                                  (Int *)CONCAT44(stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  stack.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int *)CONCAT44(marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  marked.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                  (Int)uVar15,
                                  work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
        iVar14 = 0;
        if (IVar12 < (int)uVar11) {
          uVar17 = (ulong)IVar12;
          iVar14 = 0;
          do {
            iVar2 = *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_) + uVar17 * 4);
            iVar14 = iVar14 + (int)((ulong)((long)blocks.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)blocks.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
            uVar17 = uVar17 + 1;
          } while ((uVar11 & 0x7fffffff) != uVar17);
        }
        piVar5 = blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (piVar13 = blocks.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar13 != piVar5; piVar13 = piVar13 + 1) {
          colcounts[*piVar13] = iVar14;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uVar11 & 0x7fffffff));
    }
  }
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if (local_1c8 != (pointer)0x0) {
    operator_delete(local_1c8);
  }
  if (local_1e0 != (Int *)0x0) {
    operator_delete(local_1e0);
  }
  if (marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    operator_delete(marked_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&blocks);
  if (pdVar9 != (pointer)0x0) {
    operator_delete(pdVar9);
  }
  if (piVar8 != (pointer)0x0) {
    operator_delete(piVar8);
  }
  if (pdVar7 != (pointer)0x0) {
    operator_delete(pdVar7);
  }
  if (Ai != (Int *)0x0) {
    operator_delete(Ai);
  }
  if (piVar6 != (pointer)0x0) {
    operator_delete(piVar6);
  }
  if (jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SymbolicInvert(const Model& model, const std::vector<Int>& basis,
                    Int* rowcounts, Int* colcounts) {
    const SparseMatrix& AI = model.AI();
    const Int m = AI.rows();
    assert((Int)basis.size() == m);

    // jmatch is a permutation of basis such that B = AI[:,jmatch] has a
    // zero-free diagonal.
    std::vector<Int> jmatch = Matching(model, RandomPermute(basis));
    SparseMatrix BT = CopyColumns(AI, jmatch);
    BT = Transpose(BT);

    std::vector<std::vector<Int> > blocks = Blockperm(AI, jmatch, BT);
    SparseMatrix C = CoarsenedGraph(BT, blocks);

    const Int nb = blocks.size();
    std::vector<Int> stack(nb), marked(nb), work(nb);

    if (rowcounts) {
        std::vector<Int> jcount(AI.cols(), -1);
        std::fill(marked.begin(), marked.end(), -1);
        const Int* Cp = C.colptr();
        const Int* Ci = C.rowidx();
        for (Int b = 0; b < nb; b++) {
            Int top = DepthFirstSearch(b, Cp, Ci, nullptr, nb, stack.data(),
                                       marked.data(), b, work.data());
            Int nz = 0;
            for (Int t = top; t < nb; t++)
                nz += blocks[stack[t]].size();
            for (Int i : blocks[b])
                jcount[jmatch[i]] = nz;
        }
        for (Int p = 0; p < m; p++) {
            rowcounts[p] = jcount[basis[p]];
            assert(rowcounts[p] >= 0);
        }
    }

    if (colcounts) {
        C = Transpose(C);
        std::fill(marked.begin(), marked.end(), -1);
        const Int* Cp = C.colptr();
        const Int* Ci = C.rowidx();
        for (Int b = 0; b < nb; b++) {
            Int top = DepthFirstSearch(b, Cp, Ci, nullptr, nb, stack.data(),
                                       marked.data(), b, work.data());
            Int nz = 0;
            for (Int t = top; t < nb; t++)
                nz += blocks[stack[t]].size();
            for (Int i : blocks[b])
                colcounts[i] = nz;
        }
    }
}